

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::fpToString<float>(string *__return_storage_ptr__,float value,int precision)

{
  long lVar1;
  ReusableStringStream rss;
  string local_38 [32];
  
  if (NAN(value)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"nan",(allocator *)local_38);
  }
  else {
    ReusableStringStream::ReusableStringStream(&rss);
    lVar1 = *(long *)rss.m_oss;
    *(long *)(rss.m_oss + *(long *)(lVar1 + -0x18) + 8) = (long)precision;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(rss.m_oss + lVar1 + 0x18) = *(uint *)(rss.m_oss + lVar1 + 0x18) & 0xfffffefb | 4;
    std::ostream::operator<<(rss.m_oss,value);
    std::__cxx11::stringbuf::str();
    lVar1 = std::__cxx11::string::find_last_not_of((char)__return_storage_ptr__,0x30);
    if ((lVar1 != -1) && (lVar1 != __return_storage_ptr__->_M_string_length - 1)) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_38);
      std::__cxx11::string::~string(local_38);
    }
    ReusableStringStream::~ReusableStringStream(&rss);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fpToString( T value, int precision ) {
    if (Catch::isnan(value)) {
        return "nan";
    }

    ReusableStringStream rss;
    rss << std::setprecision( precision )
        << std::fixed
        << value;
    std::string d = rss.str();
    std::size_t i = d.find_last_not_of( '0' );
    if( i != std::string::npos && i != d.size()-1 ) {
        if( d[i] == '.' )
            i++;
        d = d.substr( 0, i+1 );
    }
    return d;
}